

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O1

void __thiscall cs::process_context::process_context(process_context *this,size_t ss)

{
  listener_type local_78;
  listener_type local_58;
  
  (this->is_sigint_raised)._M_base._M_i = false;
  (this->version)._M_dataplus._M_p = (pointer)&(this->version).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->version,"3.4.3 Castor fiber(Stable) Build 14","");
  (this->std_version).type = true;
  (this->std_version).data._int = 0x3364c;
  this->output_precision = 8;
  this->exit_code = 0;
  (this->import_path)._M_dataplus._M_p = (pointer)&(this->import_path).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->import_path,".","");
  this->stack_size = ss;
  (this->stack).m_start = (any *)0x0;
  (this->stack).m_current = (any *)0x0;
  (this->stack).m_data = (aligned_type *)0x0;
  (this->stack).m_size = 0;
  stack_type<cs_impl::any,_std::allocator>::resize(&this->stack,ss);
  local_58.super__Function_base._M_functor._8_8_ = 0;
  local_58.super__Function_base._M_functor._M_unused._M_function_pointer =
       on_process_exit_default_handler;
  local_58._M_invoker = std::_Function_handler<bool_(void_*),_bool_(*)(void_*)>::_M_invoke;
  local_58.super__Function_base._M_manager =
       std::_Function_handler<bool_(void_*),_bool_(*)(void_*)>::_M_manager;
  event_type::event_type(&this->on_process_exit,&local_58);
  if (local_58.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.super__Function_base._M_manager)
              ((_Any_data *)&local_58,(_Any_data *)&local_58,__destroy_functor);
  }
  local_78.super__Function_base._M_functor._8_8_ = 0;
  local_78.super__Function_base._M_functor._M_unused._M_function_pointer =
       on_process_exit_default_handler;
  local_78._M_invoker = std::_Function_handler<bool_(void_*),_bool_(*)(void_*)>::_M_invoke;
  local_78.super__Function_base._M_manager =
       std::_Function_handler<bool_(void_*),_bool_(*)(void_*)>::_M_manager;
  event_type::event_type(&this->on_process_sigint,&local_78);
  if (local_78.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_78.super__Function_base._M_manager)
              ((_Any_data *)&local_78,(_Any_data *)&local_78,__destroy_functor);
  }
  this->std_eh_callback = std_defalt_exception_handler;
  this->cs_eh_callback = cs_defalt_exception_handler;
  LOCK();
  (this->is_sigint_raised)._M_base._M_i = false;
  UNLOCK();
  return;
}

Assistant:

explicit process_context(std::size_t ss) : stack_size(ss), stack(ss), on_process_exit(&on_process_exit_default_handler), on_process_sigint(&on_process_exit_default_handler)
		{
			is_sigint_raised = false;
		}